

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeVST1LN(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  ushort uVar1;
  DecodeStatus DVar2;
  uint uVar3;
  uint uVar4;
  ulong Val;
  
  DVar2 = MCDisassembler_Fail;
  switch(Insn >> 10 & 3) {
  case 0:
    if ((Insn & 0x10) != 0) {
      return MCDisassembler_Fail;
    }
    uVar3 = Insn >> 5 & 7;
    Val = 0;
    break;
  case 1:
    if ((Insn & 0x20) != 0) {
      return MCDisassembler_Fail;
    }
    uVar3 = Insn >> 6 & 3;
    Val = (ulong)(Insn >> 3 & 2);
    break;
  case 2:
    if ((Insn & 0x40) != 0) {
      return MCDisassembler_Fail;
    }
    uVar3 = Insn >> 7 & 1;
    uVar4 = Insn >> 4 & 3;
    Val = (ulong)uVar4;
    if ((Insn >> 4 & 3) != 0) {
      if (uVar4 != 3) {
        return MCDisassembler_Fail;
      }
      Val = 4;
    }
    break;
  case 3:
    goto switchD_001d4893_caseD_3;
  }
  uVar4 = Insn & 0xf;
  uVar1 = GPRDecoderTable[Insn >> 0x10 & 0xf];
  MCOperand_CreateReg0(Inst,(uint)uVar1);
  if (uVar4 == 0xf) {
    MCOperand_CreateImm0(Inst,Val);
  }
  else {
    MCOperand_CreateReg0(Inst,(uint)uVar1);
    MCOperand_CreateImm0(Inst,Val);
    if (uVar4 == 0xd) {
      uVar4 = 0;
    }
    else {
      uVar4 = (uint)GPRDecoderTable[uVar4];
    }
    MCOperand_CreateReg0(Inst,uVar4);
  }
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf]);
  MCOperand_CreateImm0(Inst,(ulong)uVar3);
  DVar2 = MCDisassembler_Success;
switchD_001d4893_caseD_3:
  return DVar2;
}

Assistant:

static DecodeStatus DecodeVST1LN(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned size, align = 0, index = 0;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	size = fieldFromInstruction_4(Insn, 10, 2);

	switch (size) {
		default:
			return MCDisassembler_Fail;
		case 0:
			if (fieldFromInstruction_4(Insn, 4, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 5, 3);
			break;
		case 1:
			if (fieldFromInstruction_4(Insn, 5, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 6, 2);
			if (fieldFromInstruction_4(Insn, 4, 1))
				align = 2;
			break;
		case 2:
			if (fieldFromInstruction_4(Insn, 6, 1))
				return MCDisassembler_Fail; // UNDEFINED
			index = fieldFromInstruction_4(Insn, 7, 1);

			switch (fieldFromInstruction_4(Insn, 4, 2)) {
				case 0: 
					align = 0; break;
				case 3:
					align = 4; break;
				default:
					return MCDisassembler_Fail;
			}
			break;
	}

	if (Rm != 0xF) { // Writeback
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, align);
	if (Rm != 0xF) {
		if (Rm != 0xD) {
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
				return MCDisassembler_Fail;
		} else
			MCOperand_CreateReg0(Inst, 0);
	}

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, index);

	return S;
}